

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_got_exit(event_base *event_base)

{
  int iVar1;
  
  if (event_base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,event_base->th_base_lock);
  }
  iVar1 = event_base->event_gotterm;
  if (event_base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,event_base->th_base_lock);
  }
  return iVar1;
}

Assistant:

int
event_base_got_exit(struct event_base *event_base)
{
	int res;
	EVBASE_ACQUIRE_LOCK(event_base, th_base_lock);
	res = event_base->event_gotterm;
	EVBASE_RELEASE_LOCK(event_base, th_base_lock);
	return res;
}